

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void TimerAOver(FM_ST *ST)

{
  int iVar1;
  
  if ((ST->mode & 4) != 0) {
    FM_STATUS_SET(ST,1);
  }
  iVar1 = 0x400 - ST->TA;
  ST->TAC = iVar1;
  if (ST->timer_handler != (FM_TIMERHANDLER)0x0) {
    (*ST->timer_handler)(ST->param,'\0',iVar1 * ST->timer_prescaler,ST->clock);
    iVar1 = ST->TAC;
  }
  ST->TAC = iVar1 << 0xc;
  return;
}

Assistant:

INLINE void TimerAOver(FM_ST *ST)
{
	/* set status (if enabled) */
	if(ST->mode & 0x04) FM_STATUS_SET(ST,0x01);
	/* clear or reload the counter */
	ST->TAC = (1024-ST->TA);
	if (ST->timer_handler) (ST->timer_handler)(ST->param,0,ST->TAC * ST->timer_prescaler,ST->clock);
	ST->TAC *= 4096;
}